

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O3

void fe::operations::
     applyOperationT<fe::operations::op_blend_subtract,fe::PixelDISTANCE,fe::PixelR8G8B8A8>
               (op_blend_subtract *op,PixelDISTANCE *srcPixelFormat,PixelR8G8B8A8 *destPixelFormat,
               ImageData *src,ImageData *dest)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  byte *pbVar5;
  int iVar6;
  byte *pbVar7;
  byte bVar8;
  int iVar9;
  byte bVar10;
  float fVar11;
  
  bVar4 = check(src,dest);
  if ((bVar4) && (iVar1 = (dest->super_fe_image).h, iVar1 != 0)) {
    iVar2 = (dest->super_fe_image).w;
    pbVar7 = (dest->super_fe_image).data;
    iVar6 = 0;
    iVar3 = iVar2;
    pbVar5 = pbVar7;
    do {
      for (; iVar3 != 0; iVar3 = iVar3 + -1) {
        fVar11 = 255.0 / (float)pbVar7[3];
        iVar9 = (int)((float)*pbVar7 - (float)*pbVar7 * fVar11);
        bVar8 = (byte)iVar9;
        if (iVar9 < 1) {
          bVar8 = 0;
        }
        iVar9 = (int)((float)pbVar7[1] - (float)pbVar7[1] * fVar11);
        bVar10 = (byte)iVar9;
        if (iVar9 < 1) {
          bVar10 = 0;
        }
        iVar9 = (int)((float)pbVar7[2] - fVar11 * (float)pbVar7[2]);
        if (iVar9 < 1) {
          iVar9 = 0;
        }
        *pbVar7 = bVar8;
        pbVar7[1] = bVar10;
        pbVar7[2] = (byte)iVar9;
        pbVar7[3] = 0;
        pbVar7 = pbVar7 + (dest->super_fe_image).bytespp;
      }
      pbVar7 = pbVar5 + (dest->super_fe_image).pitch;
      iVar6 = iVar6 + 1;
      iVar3 = iVar2;
      pbVar5 = pbVar7;
    } while (iVar6 != iVar1);
  }
  return;
}

Assistant:

void applyOperationT(const Op& op, const Src& srcPixelFormat, Dest& destPixelFormat, const ImageData& src, const ImageData& dest)
        {
            if (!check(src, dest))
                return;

            const unsigned char* srcBuffer = (unsigned char*)src.data;
            unsigned char* destBuffer = (unsigned char*)dest.data;

            int w = dest.w;
            int h = dest.h;

            for (int y = 0; y != h; ++y)
            {
                const unsigned char* srcLine = srcBuffer;
                unsigned char* destLine = destBuffer;

                for (int x = 0; x != w; ++x)
                {
                    op(srcPixelFormat, destPixelFormat, srcLine, destLine, x, y);

                    destLine += dest.bytespp;
                    srcLine += src.bytespp;
                }

                srcBuffer += src.pitch;
                destBuffer += dest.pitch;
            }
        }